

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  int iVar1;
  Rep *pRVar2;
  undefined4 extraout_var;
  ImplicitWeakMessage *pIVar3;
  int iVar4;
  
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar1 = this->current_size_;
    iVar4 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar4 = pRVar2->allocated_size;
    if (iVar1 < iVar4) {
      this->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar2->elements[iVar1];
    }
    if (iVar4 != this->total_size_) goto LAB_0032d6cc;
  }
  if (iVar1 <= iVar4) {
    InternalExtend(this,(iVar4 - iVar1) + 1);
    pRVar2 = this->rep_;
  }
LAB_0032d6cc:
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  if (prototype == (MessageLite *)0x0) {
    pIVar3 = Arena::CreateMessageInternal<google::protobuf::internal::ImplicitWeakMessage>
                       (this->arena_);
  }
  else {
    iVar1 = (*prototype->_vptr_MessageLite[3])(prototype);
    pIVar3 = (ImplicitWeakMessage *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = pIVar3;
  return &pIVar3->super_MessageLite;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != nullptr && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}